

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall kj::_::XThreadEvent::done(XThreadEvent *this)

{
  Executor *pEVar1;
  Exception *this_00;
  EventLoop *this_01;
  long lVar2;
  Fault f;
  DebugComparison<const_kj::Executor_*,_const_kj::Executor_*> _kjCondition;
  anon_enum_32 local_14;
  
  pEVar1 = (this->targetExecutor).ptr;
  this_01 = anon_unknown_173::currentEventLoop();
  _kjCondition.right = EventLoop::getExecutor(this_01);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = pEVar1 == _kjCondition.right;
  _kjCondition.left = pEVar1;
  if (!_kjCondition.result) {
    Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Executor_const*,kj::Executor_const*>&,char_const(&)[34]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
               ,0x439,FAILED,"targetExecutor.get() == &currentEventLoop().getExecutor()",
               "_kjCondition,\"calling done() from wrong thread?\"",&_kjCondition,
               (char (*) [34])"calling done() from wrong thread?");
    Debug::Fault::fatal(&f);
  }
  sendReply(this);
  this_00 = (Exception *)(((this->targetExecutor).ptr)->impl).ptr;
  _kjCondition.left = (Executor *)((ulong)_kjCondition.left & 0xffffffffffffff00);
  Mutex::lock((Mutex *)this_00,0);
  local_14 = this->state;
  lVar2 = 0x68;
  f.exception = this_00;
  if (local_14 != EXECUTING) {
    if (local_14 != CANCELING) {
      Debug::Fault::Fault<kj::Exception::Type,char_const(&)[34],unsigned_int>
                ((Fault *)&_kjCondition,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
                 ,0x44a,FAILED,(char *)0x0,"\"can\'t call done() from this state\", (uint)state",
                 (char (*) [34])"can\'t call done() from this state",&local_14);
      Debug::Fault::fatal((Fault *)&_kjCondition);
    }
    lVar2 = 0x38;
  }
  List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>::remove
            ((List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink> *)
             ((long)this_00->trace + lVar2 + -0x68),(char *)this);
  this->state = DONE;
  Mutex::unlock((Mutex *)this_00,EXCLUSIVE,(Waiter *)0x0);
  return;
}

Assistant:

void XThreadEvent::done() {
  KJ_ASSERT(targetExecutor.get() == &currentEventLoop().getExecutor(),
      "calling done() from wrong thread?");

  sendReply();

  {
    auto lock = targetExecutor->impl->state.lockExclusive();

    switch (state) {
      case EXECUTING:
        lock->executing.remove(*this);
        break;
      case CANCELING:
        // Sending thread requested cancellation, but we're done anyway, so it doesn't matter at this
        // point.
        lock->cancel.remove(*this);
        break;
      default:
        KJ_FAIL_ASSERT("can't call done() from this state", (uint)state);
    }

    setDoneState();
  }
}